

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-trace.cpp
# Opt level: O0

void __thiscall dynamicgraph::CustomEntity::testDebugTrace(CustomEntity *this)

{
  ulong uVar1;
  ostream *poVar2;
  CustomEntity *this_local;
  
  uVar1 = std::ios::good();
  if ((uVar1 & 1) != 0) {
    poVar2 = std::operator<<(_DAT_0011d3e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
                            );
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"testDebugTrace");
    poVar2 = std::operator<<(poVar2,"(#");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2d);
    poVar2 = std::operator<<(poVar2,") :");
    poVar2 = std::operator<<(poVar2,"# In {");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  uVar1 = std::ios::good();
  if ((uVar1 & 1) != 0) {
    poVar2 = std::operator<<(_DAT_0011d3e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
                            );
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"testDebugTrace");
    poVar2 = std::operator<<(poVar2,"(#");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x30);
    poVar2 = std::operator<<(poVar2,") :");
    poVar2 = std::operator<<(poVar2,"# In/Out { }");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  uVar1 = std::ios::good();
  if ((uVar1 & 1) != 0) {
    poVar2 = std::operator<<(_DAT_0011d3e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
                            );
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"testDebugTrace");
    poVar2 = std::operator<<(poVar2,"(#");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
    poVar2 = std::operator<<(poVar2,") :");
    poVar2 = std::operator<<(poVar2,"Here is a test");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  uVar1 = std::ios::good();
  if ((uVar1 & 1) != 0) {
    poVar2 = std::operator<<(_DAT_0011d3e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
                            );
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"testDebugTrace");
    poVar2 = std::operator<<(poVar2,"(#");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
    poVar2 = std::operator<<(poVar2,") :");
    poVar2 = std::operator<<(poVar2,"# Out }");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void testDebugTrace() {
    /// Test debugging information when entering the code.
    dgDEBUGIN(5);

    /// Intermediate test.
    dgDEBUGINOUT(5);

    dgDEBUG(5) << "Here is a test" << std::endl;

    /// Test debugging information when going out of the code.
    dgDEBUGOUT(5);
  }